

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometryVertexBuffer
          (OgreXmlSerializer *this,VertexDataXml *dest)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  DeadlyImportError *pDVar5;
  Logger *pLVar6;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar7;
  basic_formatter *pbVar8;
  size_type sVar9;
  reference pvVar10;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  *this_00;
  reference this_01;
  ulong uVar11;
  bool local_af9;
  uint32_t local_ac8;
  bool local_ac2;
  bool local_ac1;
  bool local_ab2;
  size_type local_ab0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  string local_930;
  uint local_910;
  undefined1 local_909;
  uint i_1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  string local_788;
  undefined1 local_761;
  size_type local_760;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  string local_5e0;
  undefined1 local_5b9;
  size_type local_5b8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  string local_438;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_2a0;
  byte local_279;
  undefined1 local_278 [7];
  bool warn;
  aiVector3D uv;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *uvs_1;
  iterator __end7;
  iterator __begin7;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  *__range7;
  aiVector3D tangent;
  aiVector3D normal;
  aiVector3D pos;
  bool warnColorSpecular;
  bool warnColorDiffuse;
  bool warnBinormal;
  size_t len;
  size_t i;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  uint32_t local_20;
  bool local_1b;
  bool local_1a;
  bool local_19;
  uint32_t uvs;
  bool tangents;
  bool normals;
  bool positions;
  VertexDataXml *dest_local;
  OgreXmlSerializer *this_local;
  
  _uvs = dest;
  dest_local = (VertexDataXml *)this;
  bVar3 = HasAttribute(this,"positions");
  local_ab2 = false;
  if (bVar3) {
    local_ab2 = ReadAttribute<bool>(this,"positions");
  }
  local_19 = local_ab2;
  bVar3 = HasAttribute(this,"normals");
  local_ac1 = false;
  if (bVar3) {
    local_ac1 = ReadAttribute<bool>(this,"normals");
  }
  local_1a = local_ac1;
  bVar3 = HasAttribute(this,"tangents");
  local_ac2 = false;
  if (bVar3) {
    local_ac2 = ReadAttribute<bool>(this,"tangents");
  }
  local_1b = local_ac2;
  bVar3 = HasAttribute(this,"texture_coords");
  if (bVar3) {
    local_ac8 = ReadAttribute<unsigned_int>(this,"texture_coords");
  }
  else {
    local_ac8 = 0;
  }
  local_20 = local_ac8;
  if (((local_19 & 1U) == 0) && (bVar3 = VertexDataXml::HasPositions(_uvs), !bVar3)) {
    local_55 = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Vertex buffer does not contain positions!",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if ((local_19 & 1U) != 0) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"    - Contains positions");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&_uvs->positions,(ulong)(_uvs->super_IVertexData).count);
  }
  if ((local_1a & 1U) != 0) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"    - Contains normals");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&_uvs->normals,(ulong)(_uvs->super_IVertexData).count);
  }
  if ((local_1b & 1U) != 0) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"    - Contains tangents");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&_uvs->tangents,(ulong)(_uvs->super_IVertexData).count);
  }
  if (local_20 != 0) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[16]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
               (char (*) [16])"    - Contains ");
    pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&i,
                        &local_20);
    pbVar8 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar7,(char (*) [16])" texture coords");
    Formatter::basic_formatter::operator_cast_to_string(&local_78,pbVar8);
    Logger::debug(pLVar6,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize(&_uvs->uvs,(ulong)local_20);
    len = 0;
    sVar9 = std::
            vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
            ::size(&_uvs->uvs);
    for (; len < sVar9; len = len + 1) {
      pvVar10 = std::
                vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                ::operator[](&_uvs->uvs,len);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (pvVar10,(ulong)(_uvs->super_IVertexData).count);
    }
  }
  bVar3 = true;
  bVar1 = true;
  bVar2 = true;
  NextNode_abi_cxx11_(this);
  do {
    while( true ) {
      bVar4 = std::operator==(&this->m_currentNodeName,nnVertex);
      local_af9 = true;
      if (!bVar4) {
        bVar4 = std::operator==(&this->m_currentNodeName,nnPosition);
        local_af9 = true;
        if (!bVar4) {
          bVar4 = std::operator==(&this->m_currentNodeName,nnNormal);
          local_af9 = true;
          if (!bVar4) {
            bVar4 = std::operator==(&this->m_currentNodeName,nnTangent);
            local_af9 = true;
            if (!bVar4) {
              bVar4 = std::operator==(&this->m_currentNodeName,nnBinormal);
              local_af9 = true;
              if (!bVar4) {
                bVar4 = std::operator==(&this->m_currentNodeName,nnTexCoord);
                local_af9 = true;
                if (!bVar4) {
                  bVar4 = std::operator==(&this->m_currentNodeName,nnColorDiffuse);
                  local_af9 = true;
                  if (!bVar4) {
                    local_af9 = std::operator==(&this->m_currentNodeName,nnColorSpecular);
                  }
                }
              }
            }
          }
        }
      }
      if (local_af9 == false) {
        sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&_uvs->positions);
        if (sVar9 != (_uvs->super_IVertexData).count) {
          local_5b9 = 1;
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_5b0);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_5b0,(char (*) [11])"Read only ");
          local_5b8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                (&_uvs->positions);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,&local_5b8);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(char (*) [34])" positions when should have read ");
          pbVar8 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(uint *)_uvs);
          Formatter::basic_formatter::operator_cast_to_string(&local_438,pbVar8);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_438);
          local_5b9 = 0;
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        if (((local_1a & 1U) != 0) &&
           (sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (&_uvs->normals), sVar9 != (_uvs->super_IVertexData).count)) {
          local_761 = 1;
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_758);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_758,(char (*) [11])"Read only ");
          local_760 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                (&_uvs->normals);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,&local_760);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(char (*) [32])" normals when should have read ");
          pbVar8 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(uint *)_uvs);
          Formatter::basic_formatter::operator_cast_to_string(&local_5e0,pbVar8);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_5e0);
          local_761 = 0;
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        if (((local_1b & 1U) != 0) &&
           (sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (&_uvs->tangents), sVar9 != (_uvs->super_IVertexData).count)) {
          local_909 = 1;
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_900);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_900,(char (*) [11])"Read only ");
          _i_1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&_uvs->tangents);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(unsigned_long *)&i_1);
          pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(char (*) [33])" tangents when should have read ");
          pbVar8 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar7,(uint *)_uvs);
          Formatter::basic_formatter::operator_cast_to_string(&local_788,pbVar8);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_788);
          local_909 = 0;
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        local_910 = 0;
        while( true ) {
          uVar11 = (ulong)local_910;
          sVar9 = std::
                  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                  ::size(&_uvs->uvs);
          if (sVar9 <= uVar11) {
            return;
          }
          pvVar10 = std::
                    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                    ::operator[](&_uvs->uvs,(ulong)local_910);
          sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(pvVar10)
          ;
          if (sVar9 != (_uvs->super_IVertexData).count) break;
          local_910 = local_910 + 1;
        }
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_aa8);
        pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_aa8,(char (*) [11])"Read only ");
        pvVar10 = std::
                  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                  ::operator[](&_uvs->uvs,(ulong)local_910);
        local_ab0 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (pvVar10);
        pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar7,&local_ab0);
        pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar7,(char (*) [19])" uvs for uv index ");
        pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar7,&local_910);
        pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar7,(char (*) [24])0xc7616c);
        pbVar8 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar7,(uint *)_uvs);
        Formatter::basic_formatter::operator_cast_to_string(&local_930,pbVar8);
        DeadlyImportError::DeadlyImportError(pDVar5,&local_930);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      bVar4 = std::operator==(&this->m_currentNodeName,nnVertex);
      if (bVar4) {
        NextNode_abi_cxx11_(this);
      }
      if (((local_19 & 1U) == 0) ||
         (bVar4 = std::operator==(&this->m_currentNodeName,nnPosition), !bVar4)) break;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&normal.y);
      normal.y = ReadAttribute<float>(this,anX);
      normal.z = ReadAttribute<float>(this,anY);
      ReadAttribute<float>(this,anZ);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&_uvs->positions,(value_type *)&normal.y);
LAB_006f9274:
      NextNode_abi_cxx11_(this);
    }
    if (((local_1a & 1U) != 0) &&
       (bVar4 = std::operator==(&this->m_currentNodeName,nnNormal), bVar4)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&tangent.y);
      tangent.y = ReadAttribute<float>(this,anX);
      tangent.z = ReadAttribute<float>(this,anY);
      normal.x = ReadAttribute<float>(this,anZ);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&_uvs->normals,(value_type *)&tangent.y);
      goto LAB_006f9274;
    }
    if (((local_1b & 1U) != 0) &&
       (bVar4 = std::operator==(&this->m_currentNodeName,nnTangent), bVar4)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&__range7);
      __range7._0_4_ = ReadAttribute<float>(this,anX);
      __range7._4_4_ = ReadAttribute<float>(this,anY);
      tangent.x = ReadAttribute<float>(this,anZ);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&_uvs->tangents,(value_type *)&__range7);
      goto LAB_006f9274;
    }
    if ((local_20 == 0) || (bVar4 = std::operator==(&this->m_currentNodeName,nnTexCoord), !bVar4)) {
      local_279 = 1;
      bVar4 = std::operator==(&this->m_currentNodeName,nnBinormal);
      if (bVar4) {
        if (bVar3) {
          bVar3 = false;
        }
        else {
          local_279 = 0;
        }
      }
      else {
        bVar4 = std::operator==(&this->m_currentNodeName,nnColorDiffuse);
        if (bVar4) {
          if (bVar1) {
            bVar1 = false;
          }
          else {
            local_279 = 0;
          }
        }
        else {
          bVar4 = std::operator==(&this->m_currentNodeName,nnColorSpecular);
          if (bVar4) {
            if (bVar2) {
              bVar2 = false;
            }
            else {
              local_279 = 0;
            }
          }
        }
      }
      if ((local_279 & 1) != 0) {
        pLVar6 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[59]>
                  (&local_418,
                   (char (*) [59])"Vertex buffer attribute read not implemented for element: ");
        pbVar8 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_418,&this->m_currentNodeName);
        Formatter::basic_formatter::operator_cast_to_string(&local_2a0,pbVar8);
        Logger::warn(pLVar6,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_418);
      }
      goto LAB_006f9274;
    }
    this_00 = &_uvs->uvs;
    __end7 = std::
             vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
             ::begin(this_00);
    uvs_1 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
            std::
            vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
            ::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end7,(__normal_iterator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_*,_std::vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>_>
                                       *)&uvs_1), bVar4) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_*,_std::vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>_>
                ::operator*(&__end7);
      bVar4 = std::operator!=(&this->m_currentNodeName,nnTexCoord);
      if (bVar4) {
        uv.y._2_1_ = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&uv.z,"Vertex buffer declared more UVs than can be found in a vertex",
                   (allocator *)((long)&uv.y + 3));
        DeadlyImportError::DeadlyImportError(pDVar5,(string *)&uv.z);
        uv.y._2_1_ = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_278);
      local_278._0_4_ = ReadAttribute<float>(this,"u");
      register0x00001200 = ReadAttribute<float>(this,"v");
      register0x00001200 = 1.0 - register0x00001200;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (this_01,(value_type *)local_278);
      NextNode_abi_cxx11_(this);
      __gnu_cxx::
      __normal_iterator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_*,_std::vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>_>
      ::operator++(&__end7);
    }
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadGeometryVertexBuffer(VertexDataXml *dest)
{
    bool positions = (HasAttribute("positions") && ReadAttribute<bool>("positions"));
    bool normals   = (HasAttribute("normals") && ReadAttribute<bool>("normals"));
    bool tangents  = (HasAttribute("tangents") && ReadAttribute<bool>("tangents"));
    uint32_t uvs   = (HasAttribute("texture_coords") ? ReadAttribute<uint32_t>("texture_coords") : 0);

    // Not having positions is a error only if a previous vertex buffer did not have them.
    if (!positions && !dest->HasPositions()) {
        throw DeadlyImportError("Vertex buffer does not contain positions!");
    }

    if (positions)
    {
        ASSIMP_LOG_DEBUG("    - Contains positions");
        dest->positions.reserve(dest->count);
    }
    if (normals)
    {
        ASSIMP_LOG_DEBUG("    - Contains normals");
        dest->normals.reserve(dest->count);
    }
    if (tangents)
    {
        ASSIMP_LOG_DEBUG("    - Contains tangents");
        dest->tangents.reserve(dest->count);
    }
    if (uvs > 0)
    {
        ASSIMP_LOG_DEBUG_F( "    - Contains ", uvs, " texture coords");
        dest->uvs.resize(uvs);
        for(size_t i=0, len=dest->uvs.size(); i<len; ++i) {
            dest->uvs[i].reserve(dest->count);
        }
    }

    bool warnBinormal = true;
    bool warnColorDiffuse = true;
    bool warnColorSpecular = true;

    NextNode();

    while(m_currentNodeName == nnVertex       ||
          m_currentNodeName == nnPosition     ||
          m_currentNodeName == nnNormal       ||
          m_currentNodeName == nnTangent      ||
          m_currentNodeName == nnBinormal     ||
          m_currentNodeName == nnTexCoord     ||
          m_currentNodeName == nnColorDiffuse ||
          m_currentNodeName == nnColorSpecular)
    {
        if (m_currentNodeName == nnVertex) {
            NextNode();
        }

        /// @todo Implement nnBinormal, nnColorDiffuse and nnColorSpecular

        if (positions && m_currentNodeName == nnPosition)
        {
            aiVector3D pos;
            pos.x = ReadAttribute<float>(anX);
            pos.y = ReadAttribute<float>(anY);
            pos.z = ReadAttribute<float>(anZ);
            dest->positions.push_back(pos);
        }
        else if (normals && m_currentNodeName == nnNormal)
        {
            aiVector3D normal;
            normal.x = ReadAttribute<float>(anX);
            normal.y = ReadAttribute<float>(anY);
            normal.z = ReadAttribute<float>(anZ);
            dest->normals.push_back(normal);
        }
        else if (tangents && m_currentNodeName == nnTangent)
        {
            aiVector3D tangent;
            tangent.x = ReadAttribute<float>(anX);
            tangent.y = ReadAttribute<float>(anY);
            tangent.z = ReadAttribute<float>(anZ);
            dest->tangents.push_back(tangent);
        }
        else if (uvs > 0 && m_currentNodeName == nnTexCoord)
        {
            for(auto &uvs : dest->uvs)
            {
                if (m_currentNodeName != nnTexCoord) {
                    throw DeadlyImportError("Vertex buffer declared more UVs than can be found in a vertex");
                }

                aiVector3D uv;
                uv.x = ReadAttribute<float>("u");
                uv.y = (ReadAttribute<float>("v") * -1) + 1; // Flip UV from Ogre to Assimp form
                uvs.push_back(uv);

                NextNode();
            }
            // Continue main loop as above already read next node
            continue;
        }
        else
        {
            /// @todo Remove this stuff once implemented. We only want to log warnings once per element.
            bool warn = true;
            if (m_currentNodeName == nnBinormal)
            {
                if (warnBinormal)
                {
                    warnBinormal = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorDiffuse)
            {
                if (warnColorDiffuse)
                {
                    warnColorDiffuse = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorSpecular)
            {
                if (warnColorSpecular)
                {
                    warnColorSpecular = false;
                }
                else
                {
                    warn = false;
                }
            }
            if (warn) {
                ASSIMP_LOG_WARN_F("Vertex buffer attribute read not implemented for element: ", m_currentNodeName);
            }
        }

        // Advance
        NextNode();
    }

    // Sanity checks
    if (dest->positions.size() != dest->count) {
      throw DeadlyImportError(Formatter::format() << "Read only " << dest->positions.size() << " positions when should have read " << dest->count);
    }
    if (normals && dest->normals.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->normals.size() << " normals when should have read " << dest->count);
    }
    if (tangents && dest->tangents.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->tangents.size() << " tangents when should have read " << dest->count);
    }
    for(unsigned int i=0; i<dest->uvs.size(); ++i)
    {
        if (dest->uvs[i].size() != dest->count) {
            throw DeadlyImportError(Formatter::format() << "Read only " << dest->uvs[i].size()
                << " uvs for uv index " << i << " when should have read " << dest->count);
        }
    }
}